

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O3

void __thiscall
cali::RuntimeConfig::RuntimeConfigImpl::read_config_files
          (RuntimeConfigImpl *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  pointer pbVar1;
  pointer pbVar2;
  ifstream fs;
  istringstream is;
  long *local_3a8 [2];
  long local_398 [2];
  byte abStack_388 [488];
  istringstream local_1a0 [120];
  ios_base local_128 [264];
  
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a8,
             "# [serial-trace]\nCALI_SERVICES_ENABLE=event,recorder,timestamp,trace\nCALI_TIMER_INCLUSIVE_DURATION=true\n# [event-trace]\nCALI_SERVICES_ENABLE=event,recorder,timestamp,trace\n# [flat-function-profile]\nCALI_SERVICES_ENABLE=aggregate,event,report,timestamp\nCALI_TIMER_INCLUSIVE_DURATION=true\nCALI_AGGREGATE_KEY=event.end#function\nCALI_REPORT_CONFIG=\"select event.end#function,sum#time.inclusive.duration where event.end#function format table order by time.inclusive.duration desc\"\n# [runtime-report]\nCALI_SERVICES_ENABLE=aggregate,event,report,timestamp\nCALI_EVENT_ENABLE_SNAPSHOT_INFO=false\nCALI_TIMER_SNAPSHOT_DURATION=true\nCALI_TIMER_INCLUSIVE_DURATION=false\nCALI_TIMER_UNIT=sec\nCALI_REPORT_CONFIG=\"select inclusive_sum(sum#time.duration) as \\\"Inclusive time\\\",sum(sum#time.duration) as \\\"Exclusive time\\\",percent_total(sum#time.duration) as \\\"Time %\\\" group by prop:nested format tree\"\nCALI_REPORT_FILENAME=stderr\n# [mpi-runtime-report]\nCALI_SERVICES_ENABLE=aggregate,event,mpi,mpireport,timestamp\nCALI_MPI_BLACKLIST=MPI_Comm_rank,MPI_Comm_size,MPI_Wtick,MPI_Wtime\nCALI_EVENT_ENABLE_SNAPSHOT_INFO=false\nCALI_TIMER_UNIT=sec\nCALI_MPIREPORT_CONFIG=\"select min(sum#time.duration) as \\\"Min time/rank\\\",max(sum#time.duration) as \\\"Max time/rank\\\", avg(sum#time.duration) as \\\"Avg time/rank\\\", percent_total(sum#time.duration) as \\\"Time % (total)\\\" group by prop:nested format tree\"\nCALI_MPIREPORT_FILENAME=stderr\n# [thread-trace]\nCALI_SERVICES_ENABLE=event:pthread:recorder:timestamp:trace\n# [mpi-msg-trace]\nCALI_SERVICES_ENABLE=event,mpi,recorder,timestamp,trace\nCALI_MPI_BLACKLIST=MPI_Comm_rank,MPI_Comm_size,MPI_Wtick,MPI_Wtime\nCALI_MPI_MSG_TRACING=true\nCALI_RECORDER_FILENAME=%mpi.rank%.cali\n"
             ,"");
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)local_3a8,_S_in);
  if (local_3a8[0] != local_398) {
    operator_delete(local_3a8[0],local_398[0] + 1);
  }
  read_config_profiles(this,(istream *)local_1a0);
  pbVar1 = (filenames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (filenames->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    std::ifstream::ifstream(local_3a8,(pbVar2->_M_dataplus)._M_p,_S_in);
    if ((abStack_388[local_3a8[0][-3]] & 5) == 0) {
      read_config_profiles(this,(istream *)local_3a8);
    }
    std::ifstream::~ifstream(local_3a8);
  }
  std::__cxx11::istringstream::~istringstream(local_1a0);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void read_config_files(const std::vector<std::string>& filenames)
    {
        // read builtin profiles

        std::istringstream is(::builtin_profiles);
        read_config_profiles(is);

        for (const auto& s : filenames) {
            std::ifstream fs(s.c_str());

            if (fs)
                read_config_profiles(fs);
        }
    }